

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O3

fid __thiscall ezexample::hash(ezexample *this,char c,string *fstr)

{
  vw *pvVar1;
  pointer pcVar2;
  vw *pvVar3;
  size_t sVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  substring sVar7;
  substring sVar8;
  char *local_70;
  long local_68;
  char local_60 [16];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  this->str[0] = c;
  pvVar1 = this->vw_ref;
  pcVar2 = (fstr->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + fstr->_M_string_length);
  pvVar3 = this->vw_ref;
  local_70 = local_60;
  sVar4 = strlen(this->str);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,this->str,this->str + sVar4);
  sVar7.end = local_70 + local_68;
  sVar7.begin = local_70;
  uVar5 = (*pvVar3->p->hasher)(sVar7,(ulong)pvVar3->hash_seed);
  sVar8.end = local_50 + local_48;
  sVar8.begin = local_50;
  uVar6 = (*pvVar1->p->hasher)(sVar8,uVar5);
  uVar5 = pvVar1->parse_mask;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return (uint)uVar5 & (uint)uVar6;
}

Assistant:

inline fid hash(char c, std::string fstr)
  {
    str[0] = c;
    return VW::hash_feature(*vw_ref, fstr, VW::hash_space(*vw_ref, str));
  }